

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSources::ProcessBYE
          (RTPSources *this,uint32_t ssrc,size_t reasonlength,void *reasondata,RTPTime *receivetime,
          RTPAddress *senderaddress)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  bool created;
  RTPInternalSourceData *srcdat;
  bool local_39;
  RTPInternalSourceData *local_38;
  
  iVar3 = GetRTCPSourceData(this,ssrc,senderaddress,&local_38,&local_39);
  if (((-1 < iVar3) && (local_38 != (RTPInternalSourceData *)0x0)) && (local_38 != this->owndata)) {
    bVar1 = (local_38->super_RTPSourceData).receivedbye;
    bVar2 = (local_38->super_RTPSourceData).validated;
    RTPInternalSourceData::ProcessBYEPacket(local_38,(uint8_t *)reasondata,reasonlength,receivetime)
    ;
    if (((bVar2 == true) && ((bVar1 & 1U) == 0)) &&
       (((local_38->super_RTPSourceData).validated != true ||
        (((local_38->super_RTPSourceData).receivedbye & 1U) != 0)))) {
      this->activecount = this->activecount + -1;
    }
    if (local_39 == true) {
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_38);
    }
    (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[10])(this,local_38);
  }
  return iVar3;
}

Assistant:

int RTPSources::ProcessBYE(uint32_t ssrc,size_t reasonlength,const void *reasondata,
		           const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	bool prevactive;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;

	// we'll ignore BYE packets for our own ssrc
	if (srcdat == owndata)
		return 0;
	
	prevactive = srcdat->IsActive();
	srcdat->ProcessBYEPacket((const uint8_t *)reasondata,reasonlength,receivetime);
	if (prevactive && !srcdat->IsActive())
		activecount--;
	
	// Call the callback
	if (created)
		OnNewSource(srcdat);
	OnBYEPacket(srcdat);
	return 0;
}